

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

TCGv_i64 read_cpu_reg_aarch64(DisasContext_conflict1 *s,int reg,int sf)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o_2;
  TCGv_i64 pTVar1;
  uintptr_t o;
  TCGOpcode opc;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = new_tmp_a64_aarch64(s);
  if (reg == 0x1f) {
    opc = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
  }
  else {
    pTVar1 = tcg_ctx->cpu_X[reg];
    if (sf == 0) {
      tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,pTVar1);
      return ret;
    }
    if (ret == pTVar1) {
      return ret;
    }
    pTVar1 = pTVar1 + (long)tcg_ctx;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_aarch64(tcg_ctx,opc,(TCGArg)(ret + (long)tcg_ctx),(TCGArg)pTVar1);
  return ret;
}

Assistant:

TCGv_i64 read_cpu_reg(DisasContext *s, int reg, int sf)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 v = new_tmp_a64(s);
    if (reg != 31) {
        if (sf) {
            tcg_gen_mov_i64(tcg_ctx, v, tcg_ctx->cpu_X[reg]);
        } else {
            tcg_gen_ext32u_i64(tcg_ctx, v, tcg_ctx->cpu_X[reg]);
        }
    } else {
        tcg_gen_movi_i64(tcg_ctx, v, 0);
    }
    return v;
}